

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

void __thiscall
cmOrderDirectoriesConstraintSOName::Report(cmOrderDirectoriesConstraintSOName *this,ostream *e)

{
  size_type sVar1;
  char *pcVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(e,"runtime library [",0x11);
  sVar1 = (this->SOName)._M_string_length;
  if (sVar1 == 0) {
    pcVar2 = (this->super_cmOrderDirectoriesConstraint).FileName._M_dataplus._M_p;
    sVar1 = (this->super_cmOrderDirectoriesConstraint).FileName._M_string_length;
  }
  else {
    pcVar2 = (this->SOName)._M_dataplus._M_p;
  }
  std::__ostream_insert<char,std::char_traits<char>>(e,pcVar2,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(e,"]",1);
  return;
}

Assistant:

void Report(std::ostream& e) override
  {
    e << "runtime library [";
    if (this->SOName.empty()) {
      e << this->FileName;
    } else {
      e << this->SOName;
    }
    e << "]";
  }